

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::
TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
::authored(TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
           *this)

{
  bool bVar1;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  *this_local;
  
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->_attrib);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = has_connections(this);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else if ((this->_value_empty & 1U) == 0) {
      if ((this->_blocked & 1U) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool authored() const {
    if (_attrib) {
      return true;
    }

    if (has_connections()) {
      return true;
    }

    if (_value_empty) {
      // Declare only.
      return true;
    }

    if (_blocked) {
      return true;
    }

    return false;
  }